

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMove7<(moira::Instr)71,(moira::Mode)10,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  StrWriter *in_RSI;
  Ea<(moira::Mode)10,_(moira::Size)2> *in_RDI;
  Ea<(moira::Mode)7,_(moira::Size)2> dst;
  Ea<(moira::Mode)10,_(moira::Size)2> src;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Align align;
  undefined6 in_stack_ffffffffffffffb8;
  u16 in_stack_ffffffffffffffbe;
  Moira *in_stack_ffffffffffffffc0;
  u16 in_stack_ffffffffffffffce;
  Moira *in_stack_ffffffffffffffd0;
  
  Op<(moira::Mode)10,(moira::Size)2>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,(u32 *)in_stack_ffffffffffffffc0);
  Op<(moira::Mode)7,(moira::Size)2>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,
             (u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  align.raw = in_RDI[1].pc;
  StrWriter::operator<<(pSVar1,align);
  pSVar1 = StrWriter::operator<<((StrWriter *)CONCAT44(align.raw,in_stack_ffffffffffffffb0),in_RDI);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)in_stack_ffffffffffffffc0,
             (Ea<(moira::Mode)7,_(moira::Size)2> *)
             CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

void
Moira::dasmMove7(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_AW,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}